

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

size_t __thiscall
Memory::Recycler::TryMarkArenaMemoryBlockList(Recycler *this,ArenaMemoryBlock *memoryBlocks)

{
  size_t sVar1;
  
  if (memoryBlocks == (ArenaMemoryBlock *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      sVar1 = sVar1 + memoryBlocks->nbytes;
      ScanMemory<false>(this,(void **)(memoryBlocks + 1),memoryBlocks->nbytes);
      memoryBlocks = (memoryBlocks->field_0).next;
    } while (memoryBlocks != (ArenaMemoryBlock *)0x0);
  }
  return sVar1;
}

Assistant:

size_t
Recycler::TryMarkArenaMemoryBlockList(ArenaMemoryBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    ArenaMemoryBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base=(void**)blockp->GetBytes();
        size_t byteCount = blockp->nbytes;
        scanRootBytes += byteCount;
        this->ScanMemory<false>(base, byteCount);
        blockp = blockp->next;
    }
    return scanRootBytes;
}